

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O3

bool __thiscall leveldb::Block::Iter::ParseNextKey(Iter *this)

{
  byte *limit;
  byte bVar1;
  char *pcVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  uint *puVar7;
  byte *pbVar8;
  byte *p;
  uint32_t non_shared;
  uint32_t value_length;
  uint32_t shared;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  pcVar2 = this->data_;
  pcVar4 = (this->value_).data_ + ((this->value_).size_ - (long)pcVar2);
  uVar3 = (uint)pcVar4;
  this->current_ = uVar3;
  uVar5 = this->restarts_;
  if (uVar5 <= uVar3) {
    this->current_ = uVar5;
    this->restart_index_ = this->num_restarts_;
    return false;
  }
  uVar6 = (ulong)pcVar4 & 0xffffffff;
  if (2 < (long)(uVar5 - uVar6)) {
    limit = (byte *)(pcVar2 + uVar5);
    pbVar8 = (byte *)(pcVar2 + uVar6);
    bVar1 = *pbVar8;
    local_1c = (uint)bVar1;
    local_24 = (uint)pbVar8[1];
    local_20 = (uint)pbVar8[2];
    if ((byte)(pbVar8[1] | bVar1 | pbVar8[2]) < 0x80) {
      pbVar8 = pbVar8 + 3;
    }
    else {
      if (uVar3 < uVar5 && -1 < (char)bVar1) {
        pbVar8 = pbVar8 + 1;
      }
      else {
        pbVar8 = (byte *)GetVarint32PtrFallback((char *)pbVar8,(char *)limit,&local_1c);
        if (pbVar8 == (byte *)0x0) goto LAB_0012993e;
      }
      if ((pbVar8 < limit) && (-1 < (char)*pbVar8)) {
        p = pbVar8 + 1;
        local_24 = (int)(char)*pbVar8;
      }
      else {
        p = (byte *)GetVarint32PtrFallback((char *)pbVar8,(char *)limit,&local_24);
        if (p == (byte *)0x0) goto LAB_0012993e;
      }
      if ((p < limit) && (-1 < (char)*p)) {
        pbVar8 = p + 1;
        local_20 = (int)(char)*p;
      }
      else {
        pbVar8 = (byte *)GetVarint32PtrFallback((char *)p,(char *)limit,&local_20);
        if (pbVar8 == (byte *)0x0) goto LAB_0012993e;
      }
    }
    if ((local_20 + local_24 <= (uint)((int)limit - (int)pbVar8)) &&
       ((ulong)local_1c <= (this->key_)._M_string_length)) {
      std::__cxx11::string::resize((ulong)&this->key_,(char)local_1c);
      std::__cxx11::string::append((char *)&this->key_,(ulong)pbVar8);
      (this->value_).data_ = (char *)(pbVar8 + local_24);
      (this->value_).size_ = (ulong)local_20;
      uVar5 = this->restart_index_ + 1;
      if (this->num_restarts_ <= uVar5) {
        return true;
      }
      puVar7 = (uint *)(this->data_ + (ulong)this->restarts_ + (ulong)uVar5 * 4);
      do {
        if (this->current_ <= *puVar7) {
          return true;
        }
        this->restart_index_ = uVar5;
        uVar5 = uVar5 + 1;
        puVar7 = puVar7 + 1;
      } while (this->num_restarts_ != uVar5);
      return true;
    }
  }
LAB_0012993e:
  CorruptionError(this);
  return false;
}

Assistant:

bool ParseNextKey() {
    current_ = NextEntryOffset();
    const char* p = data_ + current_;
    const char* limit = data_ + restarts_;  // Restarts come right after data
    if (p >= limit) {
      // No more entries to return.  Mark as invalid.
      current_ = restarts_;
      restart_index_ = num_restarts_;
      return false;
    }

    // Decode next entry
    uint32_t shared, non_shared, value_length;
    p = DecodeEntry(p, limit, &shared, &non_shared, &value_length);
    if (p == nullptr || key_.size() < shared) {
      CorruptionError();
      return false;
    } else {
      key_.resize(shared);
      key_.append(p, non_shared);
      value_ = Slice(p + non_shared, value_length);
      while (restart_index_ + 1 < num_restarts_ &&
             GetRestartPoint(restart_index_ + 1) < current_) {
        ++restart_index_;
      }
      return true;
    }
  }